

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

void __thiscall
leveldb::InternalKeyComparator::FindShortSuccessor(InternalKeyComparator *this,string *key)

{
  ulong uVar1;
  int iVar2;
  long in_FS_OFFSET;
  Slice user_key;
  string tmp;
  pointer local_58;
  ulong local_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = key->_M_string_length;
  if (uVar1 < 8) {
    __assert_fail("internal_key.size() >= 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                  ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
  }
  local_58 = (key->_M_dataplus)._M_p;
  local_50 = uVar1 - 8;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,local_58,local_58 + (uVar1 - 8));
  (*this->user_comparator_->_vptr_Comparator[5])(this->user_comparator_,&local_48);
  if (CONCAT44(local_48._M_string_length._4_4_,(undefined4)local_48._M_string_length) < local_50) {
    iVar2 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_58);
    if (iVar2 < 0) {
      PutFixed64(&local_48,0xffffffffffffff01);
      iVar2 = (*(this->super_Comparator)._vptr_Comparator[2])(this);
      if (-1 < iVar2) {
        __assert_fail("this->Compare(*key, tmp) < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.cc"
                      ,0x5f,
                      "virtual void leveldb::InternalKeyComparator::FindShortSuccessor(std::string *) const"
                     );
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                (key,&local_48);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void InternalKeyComparator::FindShortSuccessor(std::string* key) const {
  Slice user_key = ExtractUserKey(*key);
  std::string tmp(user_key.data(), user_key.size());
  user_comparator_->FindShortSuccessor(&tmp);
  if (tmp.size() < user_key.size() &&
      user_comparator_->Compare(user_key, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*key, tmp) < 0);
    key->swap(tmp);
  }
}